

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranLexer.cxx
# Opt level: O3

void yyunput(int c,char *yy_bp,yyscan_t yyscanner)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  
  puVar2 = *(undefined1 **)((long)yyscanner + 0x40);
  *puVar2 = *(undefined1 *)((long)yyscanner + 0x30);
  lVar6 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  uVar5 = *(ulong *)(lVar6 + 8);
  if (puVar2 < (undefined1 *)(uVar5 + 2)) {
    iVar8 = *(int *)(lVar6 + 0x18);
    lVar4 = uVar5 + (long)iVar8 + 2;
    uVar7 = (long)*(int *)((long)yyscanner + 0x34) + uVar5 + 2;
    if (uVar5 < uVar7) {
      do {
        puVar1 = (undefined1 *)(uVar7 - 1);
        uVar7 = uVar7 - 1;
        *(undefined1 *)(lVar4 + -1) = *puVar1;
        lVar4 = lVar4 + -1;
        lVar6 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
        ;
        uVar5 = *(ulong *)(lVar6 + 8);
      } while (uVar5 < uVar7);
      iVar8 = *(int *)(lVar6 + 0x18);
    }
    iVar3 = (int)lVar4 - (int)uVar7;
    puVar2 = puVar2 + iVar3;
    *(int *)((long)yyscanner + 0x34) = iVar8;
    *(int *)(lVar6 + 0x1c) = iVar8;
    if (puVar2 < (undefined1 *)(uVar5 + 2)) {
      yy_fatal_error("flex scanner push-back overflow",yy_bp);
    }
    yy_bp = yy_bp + iVar3;
  }
  puVar2[-1] = (char)c;
  *(char **)((long)yyscanner + 0x80) = yy_bp;
  *(undefined1 *)((long)yyscanner + 0x30) = puVar2[-1];
  *(undefined1 **)((long)yyscanner + 0x40) = puVar2 + -1;
  return;
}

Assistant:

static void yyunput (int c, char * yy_bp , yyscan_t yyscanner)
{
	char *yy_cp;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

    yy_cp = yyg->yy_c_buf_p;

	/* undo effects of setting up yytext */
	*yy_cp = yyg->yy_hold_char;

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = yyg->yy_n_chars + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			yyg->yy_n_chars = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

	yyg->yytext_ptr = yy_bp;
	yyg->yy_hold_char = *yy_cp;
	yyg->yy_c_buf_p = yy_cp;
}